

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O0

void CPU::WDC65816::ProcessorStorageConstructor::direct_x
               (AccessType type,bool is8bit,function<void_(CPU::WDC65816::MicroOp)> *target)

{
  function<void_(CPU::WDC65816::MicroOp)> *target_local;
  bool is8bit_local;
  AccessType type_local;
  
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchIncrementPC);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,OperationConstructDirectX);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPreviousPCThrowaway);
  std::function<void_(CPU::WDC65816::MicroOp)>::operator()(target,CycleFetchPreviousPCThrowaway);
  read_write(type,is8bit,target);
  return;
}

Assistant:

static void direct_x(AccessType type, bool is8bit, const std::function<void(MicroOp)> &target) {
		target(CycleFetchIncrementPC);					// DO.

		target(OperationConstructDirectX);
		target(CycleFetchPreviousPCThrowaway);			// IO.

		target(CycleFetchPreviousPCThrowaway);			// IO.

		read_write(type, is8bit, target);
	}